

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::setCursorPosition(QWidgetTextControlPrivate *this,int pos,MoveMode mode)

{
  int in_EDX;
  MoveMode in_ESI;
  QTextCursor *in_RDI;
  long in_FS_OFFSET;
  QTextCursor *in_stack_ffffffffffffffc8;
  QTextCursor local_18 [8];
  QTextCursor local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QTextCursor::setPosition((int)in_RDI + 0x88,in_ESI);
  if (in_EDX != 1) {
    QTextCursor::QTextCursor(local_10);
    QTextCursor::operator=(in_RDI,in_stack_ffffffffffffffc8);
    QTextCursor::~QTextCursor(local_10);
    QTextCursor::QTextCursor(local_18);
    QTextCursor::operator=(in_RDI,in_stack_ffffffffffffffc8);
    QTextCursor::~QTextCursor(local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::setCursorPosition(int pos, QTextCursor::MoveMode mode)
{
    cursor.setPosition(pos, mode);

    if (mode != QTextCursor::KeepAnchor) {
        selectedWordOnDoubleClick = QTextCursor();
        selectedBlockOnTrippleClick = QTextCursor();
    }
}